

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Image.cxx
# Opt level: O2

int __thiscall Fl_RGB_Image::copy(Fl_RGB_Image *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  void *__dest;
  undefined8 *puVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  void *__dest_00;
  long lVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  uchar *puVar20;
  int iVar21;
  size_t __n;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  float fVar25;
  float fVar26;
  uchar downright [4];
  uchar downleft [4];
  uchar right [4];
  uchar left [4];
  void *local_100;
  
  iVar15 = (int)dst;
  iVar1 = (this->super_Fl_Image).w_;
  iVar2 = (this->super_Fl_Image).h_;
  iVar11 = (int)src;
  if ((iVar2 != 0 && iVar1 != 0) && (iVar2 != iVar11 || iVar1 != iVar15)) {
    uVar3 = (this->super_Fl_Image).d_;
    __n = (size_t)(int)uVar3;
    if ((__n != 0) && (puVar20 = this->array, puVar20 != (uchar *)0x0)) {
      if (iVar11 < 1 || iVar15 < 1) {
        puVar7 = (undefined8 *)0x0;
      }
      else {
        local_100 = operator_new__((long)(int)(iVar11 * iVar15 * uVar3));
        puVar7 = (undefined8 *)operator_new(0x40);
        *(int *)(puVar7 + 1) = iVar15;
        *(int *)((long)puVar7 + 0xc) = iVar11;
        *(uint *)(puVar7 + 2) = uVar3;
        *puVar7 = &PTR__Fl_RGB_Image_00278218;
        puVar7[5] = local_100;
        *(undefined4 *)(puVar7 + 7) = 0;
        puVar7[4] = puVar7 + 5;
        *(undefined8 *)((long)puVar7 + 0x14) = 0x100000000;
        puVar7[6] = 1;
        iVar5 = (this->super_Fl_Image).ld_;
        iVar9 = uVar3 * iVar1;
        if (iVar5 != 0) {
          iVar9 = iVar5;
        }
        if (Fl_Image::RGB_scaling_ == FL_RGB_SCALING_NEAREST) {
          iVar18 = 0;
          iVar5 = iVar11;
          for (iVar4 = iVar11; 0 < iVar4; iVar4 = iVar4 + -1) {
            puVar20 = this->array + iVar18 * iVar9;
            uVar13 = (ulong)dst & 0xffffffff;
            for (uVar12 = (ulong)dst & 0xffffffff; 0 < (int)uVar12;
                uVar12 = (ulong)((int)uVar12 - 1)) {
              for (lVar14 = 0; lVar14 < (int)__n; lVar14 = lVar14 + 1) {
                *(uchar *)((long)local_100 + lVar14) = puVar20[lVar14];
                __n = (size_t)(uint)(this->super_Fl_Image).d_;
              }
              iVar21 = (int)uVar13 - iVar1 % iVar15;
              iVar19 = 0;
              if (iVar21 < 1) {
                iVar19 = iVar15;
              }
              iVar6 = 0;
              if (iVar21 < 1) {
                iVar6 = (int)__n;
              }
              uVar13 = (ulong)(uint)(iVar21 + iVar19);
              puVar20 = puVar20 + (long)iVar6 + (long)(int)((iVar1 / iVar15) * uVar3);
              local_100 = (void *)((long)local_100 + lVar14);
            }
            iVar19 = iVar5 - iVar2 % iVar11;
            iVar5 = 0;
            if (iVar19 < 1) {
              iVar5 = iVar11;
            }
            iVar5 = iVar19 + iVar5;
            iVar18 = iVar18 + iVar2 / iVar11 + (uint)(iVar19 < 1);
          }
        }
        else {
          iVar5 = 0;
          uVar13 = 0;
          if (0 < (int)uVar3) {
            uVar13 = (ulong)uVar3;
          }
          for (uVar12 = 0; uVar12 != ((ulong)src & 0xffffffff); uVar12 = uVar12 + 1) {
            fVar25 = (float)(int)uVar12 * ((float)(iVar2 + -1) / (float)iVar11);
            uVar23 = -(uint)(fVar25 < (float)iVar2);
            fVar25 = (float)(~uVar23 & (uint)(float)(iVar2 + -1) | (uint)fVar25 & uVar23);
            lVar14 = (long)iVar5 + (long)local_100;
            uVar23 = -(uint)((float)iVar2 <= fVar25 + 1.0);
            fVar26 = fVar25 - (float)((long)fVar25 & 0xffffffff);
            iVar4 = uVar3 * iVar15 * (int)uVar12;
            uVar16 = (int)(long)fVar25 * iVar9;
            uVar23 = (int)(long)(float)(~uVar23 & (uint)(fVar25 + 1.0) | uVar23 & (uint)fVar25) *
                     iVar9;
            for (uVar17 = 0; uVar17 != ((ulong)dst & 0xffffffff); uVar17 = uVar17 + 1) {
              fVar25 = (float)(int)uVar17 * ((float)(iVar1 + -1) / (float)iVar15);
              uVar24 = -(uint)(fVar25 < (float)iVar1);
              fVar25 = (float)(~uVar24 & (uint)(float)(iVar1 + -1) | (uint)fVar25 & uVar24);
              uVar24 = -(uint)((float)iVar1 <= fVar25 + 1.0);
              uVar22 = (ulong)(uVar3 * (int)(long)fVar25);
              memcpy(left,puVar20 + uVar22 + uVar16,__n);
              uVar10 = (ulong)((int)(long)(float)(~uVar24 & (uint)(fVar25 + 1.0) |
                                                 uVar24 & (uint)fVar25) * uVar3);
              memcpy(right,puVar20 + uVar10 + uVar16,__n);
              memcpy(downleft,puVar20 + uVar22 + uVar23,__n);
              memcpy(downright,puVar20 + uVar10 + uVar23,__n);
              if (uVar3 == 4) {
                for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
                  left[lVar8] = (uchar)(int)((float)((uint)left[3] * (uint)left[lVar8]) / 255.0);
                  right[lVar8] = (uchar)(int)((float)((uint)right[3] * (uint)right[lVar8]) / 255.0);
                  downleft[lVar8] =
                       (uchar)(int)((float)((uint)downleft[3] * (uint)downleft[lVar8]) / 255.0);
                  downright[lVar8] =
                       (uchar)(int)((float)((uint)downright[3] * (uint)downright[lVar8]) / 255.0);
                }
              }
              fVar25 = fVar25 - (float)((long)fVar25 & 0xffffffff);
              for (uVar10 = 0; uVar13 != uVar10; uVar10 = uVar10 + 1) {
                *(char *)(lVar14 + uVar10) =
                     (char)(int)(((float)downleft[uVar10] * (1.0 - fVar25) +
                                 (float)downright[uVar10] * fVar25) * fVar26 +
                                ((float)left[uVar10] * (1.0 - fVar25) +
                                (float)right[uVar10] * fVar25) * (1.0 - fVar26));
              }
              if ((uVar3 == 4) &&
                 (*(char *)((long)local_100 + uVar17 * __n + (long)iVar4 + 3) != '\0')) {
                for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
                  *(char *)(lVar14 + lVar8) =
                       (char)(int)((float)*(byte *)(lVar14 + lVar8) /
                                  ((float)*(byte *)((long)local_100 + uVar17 * __n + (long)iVar4 + 3
                                                   ) / 255.0));
                }
              }
              lVar14 = lVar14 + __n;
            }
            iVar5 = iVar5 + uVar3 * iVar15;
          }
        }
      }
      goto LAB_001b64ca;
    }
  }
  puVar20 = this->array;
  if (puVar20 == (uchar *)0x0) {
    puVar7 = (undefined8 *)operator_new(0x40);
    *(int *)(puVar7 + 1) = iVar1;
    *(int *)((long)puVar7 + 0xc) = iVar2;
    *puVar7 = &PTR__Fl_RGB_Image_00278218;
    puVar7[5] = 0;
    puVar7[6] = 0;
    *(undefined4 *)(puVar7 + 7) = 0;
    puVar7[4] = puVar7 + 5;
    *(undefined4 *)(puVar7 + 3) = 1;
    puVar7[2] = *(undefined8 *)&(this->super_Fl_Image).d_;
  }
  else {
    iVar11 = (this->super_Fl_Image).d_;
    iVar5 = iVar11 * iVar1;
    __dest = operator_new__((long)(iVar5 * iVar2));
    iVar15 = (this->super_Fl_Image).ld_;
    if (iVar15 == iVar5 || iVar15 == 0) {
      memcpy(__dest,puVar20,(long)(iVar5 * iVar2));
    }
    else {
      __dest_00 = __dest;
      iVar9 = 0;
      if (0 < iVar2) {
        iVar9 = iVar2;
      }
      while (iVar9 != 0) {
        memcpy(__dest_00,puVar20,(long)iVar5);
        puVar20 = puVar20 + iVar15;
        __dest_00 = (void *)((long)__dest_00 + (long)iVar5);
        iVar9 = iVar9 + -1;
      }
    }
    puVar7 = (undefined8 *)operator_new(0x40);
    *(int *)(puVar7 + 1) = iVar1;
    *(int *)((long)puVar7 + 0xc) = iVar2;
    *(int *)(puVar7 + 2) = iVar11;
    *puVar7 = &PTR__Fl_RGB_Image_00278218;
    puVar7[5] = __dest;
    *(undefined4 *)(puVar7 + 7) = 0;
    puVar7[4] = puVar7 + 5;
    *(undefined8 *)((long)puVar7 + 0x14) = 0x100000000;
    puVar7[6] = 1;
  }
LAB_001b64ca:
  return (int)puVar7;
}

Assistant:

Fl_Image *Fl_RGB_Image::copy(int W, int H) {
  Fl_RGB_Image	*new_image;	// New RGB image
  uchar		*new_array;	// New array for image data

  // Optimize the simple copy where the width and height are the same,
  // or when we are copying an empty image...
  if ((W == w() && H == h()) ||
      !w() || !h() || !d() || !array) {
    if (array) {
      // Make a copy of the image data and return a new Fl_RGB_Image...
      new_array = new uchar[w() * h() * d()];
      if (ld() && ld()!=w()*d()) {
        const uchar *src = array;
        uchar *dst = new_array;
        int dy, dh = h(), wd = w()*d(), wld = ld();
        for (dy=0; dy<dh; dy++) {
          memcpy(dst, src, wd);
          src += wld;
          dst += wd;
        }
      } else {
        memcpy(new_array, array, w() * h() * d());
      }
      new_image = new Fl_RGB_Image(new_array, w(), h(), d());
      new_image->alloc_array = 1;

      return new_image;
    } else {
      return new Fl_RGB_Image(array, w(), h(), d(), ld());
    }
  }
  if (W <= 0 || H <= 0) return 0;

  // OK, need to resize the image data; allocate memory and create new image
  uchar		*new_ptr;	// Pointer into new array
  const uchar	*old_ptr;	// Pointer into old array
  int		dx, dy,		// Destination coordinates
		line_d;		// stride from line to line

  // Allocate memory for the new image...
  new_array = new uchar [W * H * d()];
  new_image = new Fl_RGB_Image(new_array, W, H, d());
  new_image->alloc_array = 1;

  line_d = ld() ? ld() : w() * d();

  if (Fl_Image::RGB_scaling() == FL_RGB_SCALING_NEAREST) {

    int		c,		// Channel number
		sy,		// Source coordinate
		xerr, yerr,	// X & Y errors
		xmod, ymod,	// X & Y moduli
		xstep, ystep;	// X & Y step increments

    // Figure out Bresenham step/modulus values...
    xmod   = w() % W;
    xstep  = (w() / W) * d();
    ymod   = h() % H;
    ystep  = h() / H;

    // Scale the image using a nearest-neighbor algorithm...
    for (dy = H, sy = 0, yerr = H, new_ptr = new_array; dy > 0; dy --) {
      for (dx = W, xerr = W, old_ptr = array + sy * line_d; dx > 0; dx --) {
        for (c = 0; c < d(); c ++) *new_ptr++ = old_ptr[c];

        old_ptr += xstep;
        xerr    -= xmod;

        if (xerr <= 0) {
          xerr    += W;
	  old_ptr += d();
        }
      }

      sy   += ystep;
      yerr -= ymod;
      if (yerr <= 0) {
        yerr += H;
        sy ++;
      }
    }
  } else {
    // Bilinear scaling (FL_RGB_SCALING_BILINEAR)
    const float xscale = (w() - 1) / (float) W;
    const float yscale = (h() - 1) / (float) H;
    for (dy = 0; dy < H; dy++) {
      float oldy = dy * yscale;
      if (oldy >= h())
        oldy = float(h() - 1);
      const float yfract = oldy - (unsigned) oldy;

      for (dx = 0; dx < W; dx++) {
        new_ptr = new_array + dy * W * d() + dx * d();

        float oldx = dx * xscale;
        if (oldx >= w())
          oldx = float(w() - 1);
        const float xfract = oldx - (unsigned) oldx;

        const unsigned leftx = (unsigned)oldx;
        const unsigned lefty = (unsigned)oldy;
        const unsigned rightx = (unsigned)(oldx + 1 >= w() ? oldx : oldx + 1);
        const unsigned righty = (unsigned)oldy;
        const unsigned dleftx = (unsigned)oldx;
        const unsigned dlefty = (unsigned)(oldy + 1 >= h() ? oldy : oldy + 1);
        const unsigned drightx = (unsigned)rightx;
        const unsigned drighty = (unsigned)dlefty;

        uchar left[4], right[4], downleft[4], downright[4];
        memcpy(left, array + lefty * line_d + leftx * d(), d());
        memcpy(right, array + righty * line_d + rightx * d(), d());
        memcpy(downleft, array + dlefty * line_d + dleftx * d(), d());
        memcpy(downright, array + drighty * line_d + drightx * d(), d());

        int i;
        if (d() == 4) {
          for (i = 0; i < 3; i++) {
            left[i] = (uchar)(left[i] * left[3] / 255.0f);
            right[i] = (uchar)(right[i] * right[3] / 255.0f);
            downleft[i] = (uchar)(downleft[i] * downleft[3] / 255.0f);
            downright[i] = (uchar)(downright[i] * downright[3] / 255.0f);
          }
        }

	const float leftf = 1 - xfract;
	const float rightf = xfract;
	const float upf = 1 - yfract;
	const float downf = yfract;

        for (i = 0; i < d(); i++) {
          new_ptr[i] = (uchar)((left[i] * leftf +
                   right[i] * rightf) * upf +
                   (downleft[i] * leftf +
                   downright[i] * rightf) * downf);
        }

        if (d() == 4 && new_ptr[3]) {
          for (i = 0; i < 3; i++) {
            new_ptr[i] = (uchar)(new_ptr[i] / (new_ptr[3] / 255.0f));
          }
        }
      }
    }
  }

  return new_image;
}